

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  NodeRef *pNVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  int iVar20;
  int iVar21;
  undefined4 uVar22;
  Scene *pSVar23;
  Geometry *pGVar24;
  RTCFilterFunctionN p_Var25;
  long lVar26;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  AABBNodeMB4D *node1;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  size_t sVar40;
  ulong uVar41;
  float fVar42;
  float fVar43;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar44 [16];
  float fVar51;
  float fVar56;
  float fVar57;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar58;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar59;
  float fVar64;
  float fVar65;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar66;
  float fVar67;
  float fVar71;
  float fVar72;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar73;
  float fVar74;
  uint uVar75;
  float fVar76;
  uint uVar77;
  float fVar78;
  uint uVar79;
  float fVar80;
  uint uVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 local_a28 [16];
  long local_a10;
  long local_a08;
  ulong local_a00;
  NodeRef *local_9f8;
  undefined1 (*local_9f0) [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  float local_898 [4];
  float local_888 [4];
  float local_878 [4];
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  local_9f8 = stack + 1;
  stack[0] = root;
  fVar14 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar15 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar16 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar17 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar18 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar19 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_a00 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar39 = local_a00 ^ 0x10;
  iVar20 = (tray->tnear).field_0.i[k];
  iVar21 = (tray->tfar).field_0.i[k];
  local_9f0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  uVar34 = CONCAT71((int7)((ulong)local_9f0 >> 8),1);
LAB_0025c3cb:
  do {
    sVar40 = local_9f8[-1].ptr;
    local_9f8 = local_9f8 + -1;
    uVar35 = uVar34;
    while ((sVar40 & 8) == 0) {
      uVar35 = sVar40 & 0xfffffffffffffff0;
      fVar43 = *(float *)(ray + k * 4 + 0x70);
      pfVar6 = (float *)(uVar35 + 0x80 + local_a00);
      pfVar1 = (float *)(uVar35 + 0x20 + local_a00);
      auVar63._0_4_ = ((*pfVar6 * fVar43 + *pfVar1) - fVar14) * fVar17;
      auVar63._4_4_ = ((pfVar6[1] * fVar43 + pfVar1[1]) - fVar14) * fVar17;
      auVar63._8_4_ = ((pfVar6[2] * fVar43 + pfVar1[2]) - fVar14) * fVar17;
      auVar63._12_4_ = ((pfVar6[3] * fVar43 + pfVar1[3]) - fVar14) * fVar17;
      auVar61._4_4_ = iVar20;
      auVar61._0_4_ = iVar20;
      auVar61._8_4_ = iVar20;
      auVar61._12_4_ = iVar20;
      auVar52 = maxps(auVar61,auVar63);
      pfVar6 = (float *)(uVar35 + 0x80 + uVar37);
      pfVar1 = (float *)(uVar35 + 0x20 + uVar37);
      auVar60._0_4_ = ((*pfVar6 * fVar43 + *pfVar1) - fVar15) * fVar18;
      auVar60._4_4_ = ((pfVar6[1] * fVar43 + pfVar1[1]) - fVar15) * fVar18;
      auVar60._8_4_ = ((pfVar6[2] * fVar43 + pfVar1[2]) - fVar15) * fVar18;
      auVar60._12_4_ = ((pfVar6[3] * fVar43 + pfVar1[3]) - fVar15) * fVar18;
      pfVar6 = (float *)(uVar35 + 0x80 + uVar41);
      pfVar1 = (float *)(uVar35 + 0x20 + uVar41);
      auVar68._0_4_ = ((*pfVar6 * fVar43 + *pfVar1) - fVar16) * fVar19;
      auVar68._4_4_ = ((pfVar6[1] * fVar43 + pfVar1[1]) - fVar16) * fVar19;
      auVar68._8_4_ = ((pfVar6[2] * fVar43 + pfVar1[2]) - fVar16) * fVar19;
      auVar68._12_4_ = ((pfVar6[3] * fVar43 + pfVar1[3]) - fVar16) * fVar19;
      auVar61 = maxps(auVar60,auVar68);
      auVar61 = maxps(auVar52,auVar61);
      pfVar6 = (float *)(uVar35 + 0x80 + uVar39);
      pfVar1 = (float *)(uVar35 + 0x20 + uVar39);
      auVar69._0_4_ = ((*pfVar6 * fVar43 + *pfVar1) - fVar14) * fVar17;
      auVar69._4_4_ = ((pfVar6[1] * fVar43 + pfVar1[1]) - fVar14) * fVar17;
      auVar69._8_4_ = ((pfVar6[2] * fVar43 + pfVar1[2]) - fVar14) * fVar17;
      auVar69._12_4_ = ((pfVar6[3] * fVar43 + pfVar1[3]) - fVar14) * fVar17;
      auVar62._4_4_ = iVar21;
      auVar62._0_4_ = iVar21;
      auVar62._8_4_ = iVar21;
      auVar62._12_4_ = iVar21;
      auVar63 = minps(auVar62,auVar69);
      pfVar6 = (float *)(uVar35 + 0x80 + (uVar37 ^ 0x10));
      pfVar1 = (float *)(uVar35 + 0x20 + (uVar37 ^ 0x10));
      auVar70._0_4_ = ((*pfVar6 * fVar43 + *pfVar1) - fVar15) * fVar18;
      auVar70._4_4_ = ((pfVar6[1] * fVar43 + pfVar1[1]) - fVar15) * fVar18;
      auVar70._8_4_ = ((pfVar6[2] * fVar43 + pfVar1[2]) - fVar15) * fVar18;
      auVar70._12_4_ = ((pfVar6[3] * fVar43 + pfVar1[3]) - fVar15) * fVar18;
      pfVar6 = (float *)(uVar35 + 0x80 + (uVar41 ^ 0x10));
      pfVar1 = (float *)(uVar35 + 0x20 + (uVar41 ^ 0x10));
      auVar52._4_4_ = ((pfVar6[1] * fVar43 + pfVar1[1]) - fVar16) * fVar19;
      auVar52._0_4_ = ((*pfVar6 * fVar43 + *pfVar1) - fVar16) * fVar19;
      auVar52._8_4_ = ((pfVar6[2] * fVar43 + pfVar1[2]) - fVar16) * fVar19;
      auVar52._12_4_ = ((pfVar6[3] * fVar43 + pfVar1[3]) - fVar16) * fVar19;
      auVar52 = minps(auVar70,auVar52);
      auVar52 = minps(auVar63,auVar52);
      bVar28 = auVar61._0_4_ <= auVar52._0_4_;
      bVar29 = auVar61._4_4_ <= auVar52._4_4_;
      bVar30 = auVar61._8_4_ <= auVar52._8_4_;
      bVar31 = auVar61._12_4_ <= auVar52._12_4_;
      if (((uint)sVar40 & 7) == 6) {
        bVar28 = (fVar43 < *(float *)(uVar35 + 0xf0) && *(float *)(uVar35 + 0xe0) <= fVar43) &&
                 bVar28;
        bVar29 = (fVar43 < *(float *)(uVar35 + 0xf4) && *(float *)(uVar35 + 0xe4) <= fVar43) &&
                 bVar29;
        bVar30 = (fVar43 < *(float *)(uVar35 + 0xf8) && *(float *)(uVar35 + 0xe8) <= fVar43) &&
                 bVar30;
        bVar31 = (fVar43 < *(float *)(uVar35 + 0xfc) && *(float *)(uVar35 + 0xec) <= fVar43) &&
                 bVar31;
      }
      auVar53._0_4_ = (uint)bVar28 * -0x80000000;
      auVar53._4_4_ = (uint)bVar29 * -0x80000000;
      auVar53._8_4_ = (uint)bVar30 * -0x80000000;
      auVar53._12_4_ = (uint)bVar31 * -0x80000000;
      uVar36 = movmskps((int)root.ptr,auVar53);
      root.ptr = (size_t)uVar36;
      if (uVar36 == 0) {
        pNVar5 = stack;
        uVar34 = CONCAT71((int7)((ulong)pNVar5 >> 8),local_9f8 != pNVar5);
        if (local_9f8 != pNVar5) goto LAB_0025c3cb;
        goto LAB_0025cc20;
      }
      lVar26 = 0;
      if ((byte)uVar36 != 0) {
        for (; ((byte)uVar36 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
        }
      }
      sVar40 = *(size_t *)(uVar35 + lVar26 * 8);
      uVar36 = (uVar36 & 0xff) - 1 & uVar36 & 0xff;
      root.ptr = (size_t)uVar36;
      if (uVar36 != 0) {
        local_9f8->ptr = sVar40;
        local_9f8 = local_9f8 + 1;
        lVar26 = 0;
        if (root.ptr != 0) {
          for (; (uVar36 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
          }
        }
        sVar40 = *(size_t *)(uVar35 + lVar26 * 8);
        uVar36 = uVar36 - 1 & uVar36;
        uVar38 = (ulong)uVar36;
        if (uVar36 != 0) {
          do {
            local_9f8->ptr = sVar40;
            local_9f8 = local_9f8 + 1;
            root.ptr = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> root.ptr & 1) == 0; root.ptr = root.ptr + 1) {
              }
            }
            sVar40 = *(size_t *)(uVar35 + root.ptr * 8);
            uVar38 = uVar38 & uVar38 - 1;
          } while (uVar38 != 0);
        }
      }
    }
    local_a08 = (ulong)((uint)sVar40 & 0xf) - 8;
    if (local_a08 != 0) {
      uVar38 = sVar40 & 0xfffffffffffffff0;
      local_a10 = 0;
      do {
        root.ptr = local_a10 * 0x140;
        fVar43 = *(float *)(ray + k * 4 + 0x70);
        pfVar6 = (float *)(uVar38 + 0x90 + root.ptr);
        pfVar1 = (float *)(uVar38 + root.ptr);
        fVar51 = *pfVar6 * fVar43 + *pfVar1;
        fVar56 = pfVar6[1] * fVar43 + pfVar1[1];
        fVar57 = pfVar6[2] * fVar43 + pfVar1[2];
        fVar58 = pfVar6[3] * fVar43 + pfVar1[3];
        pfVar6 = (float *)(uVar38 + 0xa0 + root.ptr);
        pfVar1 = (float *)(uVar38 + 0x10 + root.ptr);
        fVar59 = *pfVar6 * fVar43 + *pfVar1;
        fVar64 = pfVar6[1] * fVar43 + pfVar1[1];
        fVar65 = pfVar6[2] * fVar43 + pfVar1[2];
        fVar66 = pfVar6[3] * fVar43 + pfVar1[3];
        pfVar6 = (float *)(uVar38 + 0xb0 + root.ptr);
        pfVar1 = (float *)(uVar38 + 0x20 + root.ptr);
        fVar67 = *pfVar6 * fVar43 + *pfVar1;
        fVar71 = pfVar6[1] * fVar43 + pfVar1[1];
        fVar72 = pfVar6[2] * fVar43 + pfVar1[2];
        fVar73 = pfVar6[3] * fVar43 + pfVar1[3];
        pfVar7 = (float *)(uVar38 + 0xc0 + root.ptr);
        pfVar1 = (float *)(uVar38 + 0x30 + root.ptr);
        pfVar8 = (float *)(uVar38 + 0xd0 + root.ptr);
        pfVar6 = (float *)(uVar38 + 0x40 + root.ptr);
        pfVar9 = (float *)(uVar38 + 0xe0 + root.ptr);
        pfVar2 = (float *)(uVar38 + 0x50 + root.ptr);
        pfVar10 = (float *)(uVar38 + 0xf0 + root.ptr);
        pfVar3 = (float *)(uVar38 + 0x60 + root.ptr);
        pfVar11 = (float *)(uVar38 + 0x100 + root.ptr);
        pfVar4 = (float *)(uVar38 + 0x70 + root.ptr);
        pfVar12 = (float *)(uVar38 + 0x110 + root.ptr);
        pfVar13 = (float *)(uVar38 + 0x80 + root.ptr);
        fVar86 = fVar51 - (*pfVar7 * fVar43 + *pfVar1);
        fVar87 = fVar56 - (pfVar7[1] * fVar43 + pfVar1[1]);
        fVar88 = fVar57 - (pfVar7[2] * fVar43 + pfVar1[2]);
        fVar89 = fVar58 - (pfVar7[3] * fVar43 + pfVar1[3]);
        fVar94 = fVar59 - (*pfVar8 * fVar43 + *pfVar6);
        fVar96 = fVar64 - (pfVar8[1] * fVar43 + pfVar6[1]);
        fVar98 = fVar65 - (pfVar8[2] * fVar43 + pfVar6[2]);
        fVar100 = fVar66 - (pfVar8[3] * fVar43 + pfVar6[3]);
        fVar102 = fVar67 - (*pfVar9 * fVar43 + *pfVar2);
        fVar103 = fVar71 - (pfVar9[1] * fVar43 + pfVar2[1]);
        fVar104 = fVar72 - (pfVar9[2] * fVar43 + pfVar2[2]);
        fVar105 = fVar73 - (pfVar9[3] * fVar43 + pfVar2[3]);
        fVar42 = (*pfVar10 * fVar43 + *pfVar3) - fVar51;
        fVar45 = (pfVar10[1] * fVar43 + pfVar3[1]) - fVar56;
        fVar47 = (pfVar10[2] * fVar43 + pfVar3[2]) - fVar57;
        fVar49 = (pfVar10[3] * fVar43 + pfVar3[3]) - fVar58;
        fVar82 = (*pfVar11 * fVar43 + *pfVar4) - fVar59;
        fVar83 = (pfVar11[1] * fVar43 + pfVar4[1]) - fVar64;
        fVar84 = (pfVar11[2] * fVar43 + pfVar4[2]) - fVar65;
        fVar85 = (pfVar11[3] * fVar43 + pfVar4[3]) - fVar66;
        fVar74 = (fVar43 * *pfVar12 + *pfVar13) - fVar67;
        fVar76 = (fVar43 * pfVar12[1] + pfVar13[1]) - fVar71;
        fVar78 = (fVar43 * pfVar12[2] + pfVar13[2]) - fVar72;
        fVar80 = (fVar43 * pfVar12[3] + pfVar13[3]) - fVar73;
        local_898[0] = fVar102 * fVar82 - fVar94 * fVar74;
        local_898[1] = fVar103 * fVar83 - fVar96 * fVar76;
        local_898[2] = fVar104 * fVar84 - fVar98 * fVar78;
        local_898[3] = fVar105 * fVar85 - fVar100 * fVar80;
        fVar43 = *(float *)(ray + k * 4);
        fVar46 = *(float *)(ray + k * 4 + 0x10);
        fVar48 = *(float *)(ray + k * 4 + 0x40);
        fVar50 = *(float *)(ray + k * 4 + 0x50);
        fVar51 = fVar51 - fVar43;
        fVar56 = fVar56 - fVar43;
        fVar57 = fVar57 - fVar43;
        fVar58 = fVar58 - fVar43;
        fVar59 = fVar59 - fVar46;
        fVar64 = fVar64 - fVar46;
        fVar65 = fVar65 - fVar46;
        fVar66 = fVar66 - fVar46;
        fVar106 = fVar51 * fVar50 - fVar59 * fVar48;
        fVar107 = fVar56 * fVar50 - fVar64 * fVar48;
        fVar108 = fVar57 * fVar50 - fVar65 * fVar48;
        fVar109 = fVar58 * fVar50 - fVar66 * fVar48;
        local_888[0] = fVar86 * fVar74 - fVar102 * fVar42;
        local_888[1] = fVar87 * fVar76 - fVar103 * fVar45;
        local_888[2] = fVar88 * fVar78 - fVar104 * fVar47;
        local_888[3] = fVar89 * fVar80 - fVar105 * fVar49;
        fVar43 = *(float *)(ray + k * 4 + 0x20);
        fVar46 = *(float *)(ray + k * 4 + 0x60);
        fVar67 = fVar67 - fVar43;
        fVar71 = fVar71 - fVar43;
        fVar72 = fVar72 - fVar43;
        fVar73 = fVar73 - fVar43;
        fVar110 = fVar67 * fVar48 - fVar51 * fVar46;
        fVar111 = fVar71 * fVar48 - fVar56 * fVar46;
        fVar112 = fVar72 * fVar48 - fVar57 * fVar46;
        fVar113 = fVar73 * fVar48 - fVar58 * fVar46;
        local_878[0] = fVar94 * fVar42 - fVar86 * fVar82;
        local_878[1] = fVar96 * fVar45 - fVar87 * fVar83;
        local_878[2] = fVar98 * fVar47 - fVar88 * fVar84;
        local_878[3] = fVar100 * fVar49 - fVar89 * fVar85;
        fVar95 = fVar59 * fVar46 - fVar67 * fVar50;
        fVar97 = fVar64 * fVar46 - fVar71 * fVar50;
        fVar99 = fVar65 * fVar46 - fVar72 * fVar50;
        fVar101 = fVar66 * fVar46 - fVar73 * fVar50;
        fVar90 = fVar48 * local_898[0] + fVar50 * local_888[0] + fVar46 * local_878[0];
        fVar91 = fVar48 * local_898[1] + fVar50 * local_888[1] + fVar46 * local_878[1];
        fVar92 = fVar48 * local_898[2] + fVar50 * local_888[2] + fVar46 * local_878[2];
        fVar93 = fVar48 * local_898[3] + fVar50 * local_888[3] + fVar46 * local_878[3];
        uVar75 = (uint)fVar90 & 0x80000000;
        uVar77 = (uint)fVar91 & 0x80000000;
        uVar79 = (uint)fVar92 & 0x80000000;
        uVar81 = (uint)fVar93 & 0x80000000;
        fVar43 = (float)((uint)(fVar42 * fVar95 + fVar82 * fVar110 + fVar74 * fVar106) ^ uVar75);
        fVar46 = (float)((uint)(fVar45 * fVar97 + fVar83 * fVar111 + fVar76 * fVar107) ^ uVar77);
        fVar48 = (float)((uint)(fVar47 * fVar99 + fVar84 * fVar112 + fVar78 * fVar108) ^ uVar79);
        fVar50 = (float)((uint)(fVar49 * fVar101 + fVar85 * fVar113 + fVar80 * fVar109) ^ uVar81);
        fVar74 = (float)((uint)(fVar95 * fVar86 + fVar110 * fVar94 + fVar106 * fVar102) ^ uVar75);
        fVar76 = (float)((uint)(fVar97 * fVar87 + fVar111 * fVar96 + fVar107 * fVar103) ^ uVar77);
        fVar78 = (float)((uint)(fVar99 * fVar88 + fVar112 * fVar98 + fVar108 * fVar104) ^ uVar79);
        fVar80 = (float)((uint)(fVar101 * fVar89 + fVar113 * fVar100 + fVar109 * fVar105) ^ uVar81);
        fVar42 = ABS(fVar90);
        fVar45 = ABS(fVar91);
        fVar47 = ABS(fVar92);
        fVar49 = ABS(fVar93);
        bVar28 = ((0.0 <= fVar74 && 0.0 <= fVar43) && fVar90 != 0.0) && fVar43 + fVar74 <= fVar42;
        bVar29 = ((0.0 <= fVar76 && 0.0 <= fVar46) && fVar91 != 0.0) && fVar46 + fVar76 <= fVar45;
        bVar30 = ((0.0 <= fVar78 && 0.0 <= fVar48) && fVar92 != 0.0) && fVar48 + fVar78 <= fVar47;
        bVar31 = ((0.0 <= fVar80 && 0.0 <= fVar50) && fVar93 != 0.0) && fVar50 + fVar80 <= fVar49;
        auVar33._4_4_ = -(uint)bVar29;
        auVar33._0_4_ = -(uint)bVar28;
        auVar33._8_4_ = -(uint)bVar30;
        auVar33._12_4_ = -(uint)bVar31;
        uVar36 = movmskps((int)uVar35,auVar33);
        uVar35 = (ulong)uVar36;
        if (uVar36 != 0) {
          fVar59 = (float)(uVar75 ^ (uint)(fVar51 * local_898[0] +
                                          fVar59 * local_888[0] + fVar67 * local_878[0]));
          fVar64 = (float)(uVar77 ^ (uint)(fVar56 * local_898[1] +
                                          fVar64 * local_888[1] + fVar71 * local_878[1]));
          fVar57 = (float)(uVar79 ^ (uint)(fVar57 * local_898[2] +
                                          fVar65 * local_888[2] + fVar72 * local_878[2]));
          fVar58 = (float)(uVar81 ^ (uint)(fVar58 * local_898[3] +
                                          fVar66 * local_888[3] + fVar73 * local_878[3]));
          fVar51 = *(float *)(ray + k * 4 + 0x30);
          fVar56 = *(float *)(ray + k * 4 + 0x80);
          auVar54._0_4_ = -(uint)((fVar59 <= fVar56 * fVar42 && fVar51 * fVar42 < fVar59) && bVar28)
          ;
          auVar54._4_4_ = -(uint)((fVar64 <= fVar56 * fVar45 && fVar51 * fVar45 < fVar64) && bVar29)
          ;
          auVar54._8_4_ = -(uint)((fVar57 <= fVar56 * fVar47 && fVar51 * fVar47 < fVar57) && bVar30)
          ;
          auVar54._12_4_ =
               -(uint)((fVar58 <= fVar56 * fVar49 && fVar51 * fVar49 < fVar58) && bVar31);
          uVar36 = movmskps(uVar36,auVar54);
          uVar35 = (ulong)uVar36;
          if (uVar36 != 0) {
            root.ptr = root.ptr + uVar38;
            pSVar23 = context->scene;
            auVar32._4_4_ = fVar45;
            auVar32._0_4_ = fVar42;
            auVar32._8_4_ = fVar47;
            auVar32._12_4_ = fVar49;
            auVar52 = rcpps(auVar54,auVar32);
            fVar51 = auVar52._0_4_;
            fVar65 = auVar52._4_4_;
            fVar66 = auVar52._8_4_;
            fVar67 = auVar52._12_4_;
            fVar51 = (1.0 - fVar42 * fVar51) * fVar51 + fVar51;
            fVar65 = (1.0 - fVar45 * fVar65) * fVar65 + fVar65;
            fVar66 = (1.0 - fVar47 * fVar66) * fVar66 + fVar66;
            fVar67 = (1.0 - fVar49 * fVar67) * fVar67 + fVar67;
            local_8a8[0] = fVar59 * fVar51;
            local_8a8[1] = fVar64 * fVar65;
            local_8a8[2] = fVar57 * fVar66;
            local_8a8[3] = fVar58 * fVar67;
            local_8c8._0_4_ = fVar43 * fVar51;
            local_8c8._4_4_ = fVar46 * fVar65;
            local_8c8._8_4_ = fVar48 * fVar66;
            local_8c8._12_4_ = fVar50 * fVar67;
            local_8b8._0_4_ = fVar51 * fVar74;
            local_8b8._4_4_ = fVar65 * fVar76;
            local_8b8._8_4_ = fVar66 * fVar78;
            local_8b8._12_4_ = fVar67 * fVar80;
            uVar35 = (ulong)(byte)uVar36;
            do {
              uVar27 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              local_808 = *(uint *)(root.ptr + 0x120 + uVar27 * 4);
              pGVar24 = (pSVar23->geometries).items[local_808].ptr;
              if ((pGVar24->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_838 = *(undefined4 *)(local_8c8 + uVar27 * 4);
                  fVar43 = local_8a8[uVar27 - 4];
                  *(float *)(ray + k * 4 + 0x80) = local_8a8[uVar27];
                  args.context = context->user;
                  uVar22 = *(undefined4 *)(root.ptr + 0x130 + uVar27 * 4);
                  local_818._4_4_ = uVar22;
                  local_818._0_4_ = uVar22;
                  local_818._8_4_ = uVar22;
                  local_818._12_4_ = uVar22;
                  local_828._4_4_ = fVar43;
                  local_828._0_4_ = fVar43;
                  local_828._8_4_ = fVar43;
                  local_828._12_4_ = fVar43;
                  local_868 = local_898[uVar27];
                  local_858 = local_888[uVar27];
                  local_848 = local_878[uVar27];
                  fStack_864 = local_868;
                  fStack_860 = local_868;
                  fStack_85c = local_868;
                  fStack_854 = local_858;
                  fStack_850 = local_858;
                  fStack_84c = local_858;
                  fStack_844 = local_848;
                  fStack_840 = local_848;
                  fStack_83c = local_848;
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  uStack_804 = local_808;
                  uStack_800 = local_808;
                  uStack_7fc = local_808;
                  local_7f8 = (args.context)->instID[0];
                  uStack_7f4 = local_7f8;
                  uStack_7f0 = local_7f8;
                  uStack_7ec = local_7f8;
                  local_7e8 = (args.context)->instPrimID[0];
                  uStack_7e4 = local_7e8;
                  uStack_7e0 = local_7e8;
                  uStack_7dc = local_7e8;
                  local_a28 = *local_9f0;
                  args.valid = (int *)local_a28;
                  args.geometryUserPtr = pGVar24->userPtr;
                  args.hit = (RTCHitN *)&local_868;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar24->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar24->occlusionFilterN)(&args);
                  }
                  if (local_a28 == (undefined1  [16])0x0) {
                    auVar55._8_4_ = 0xffffffff;
                    auVar55._0_8_ = 0xffffffffffffffff;
                    auVar55._12_4_ = 0xffffffff;
                    auVar55 = auVar55 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var25 = context->args->filter;
                    if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var25)(&args);
                    }
                    auVar44._0_4_ = -(uint)(local_a28._0_4_ == 0);
                    auVar44._4_4_ = -(uint)(local_a28._4_4_ == 0);
                    auVar44._8_4_ = -(uint)(local_a28._8_4_ == 0);
                    auVar44._12_4_ = -(uint)(local_a28._12_4_ == 0);
                    auVar55 = auVar44 ^ _DAT_01f7ae20;
                    auVar52 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar44
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar52;
                  }
                  if ((_DAT_01f7bb20 & auVar55) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar56;
                    goto LAB_0025cb32;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                uVar34 = uVar34 & 0xff;
                goto LAB_0025cc20;
              }
LAB_0025cb32:
              uVar35 = uVar35 ^ 1L << (uVar27 & 0x3f);
            } while (uVar35 != 0);
            uVar35 = 0;
          }
        }
        local_a10 = local_a10 + 1;
      } while (local_a10 != local_a08);
    }
    pNVar5 = stack;
    uVar34 = CONCAT71((int7)((ulong)pNVar5 >> 8),local_9f8 != pNVar5);
  } while (local_9f8 != pNVar5);
LAB_0025cc20:
  return SUB81(uVar34,0);
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }